

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O0

void __thiscall QEvdevKeyboardHandler::readKeycode(QEvdevKeyboardHandler *this)

{
  long lVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  int iVar4;
  QKeycodeAction led;
  qint64 qVar5;
  int *piVar6;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QKeycodeAction ka;
  qint32 value;
  quint16 code;
  int i;
  int result;
  int n;
  input_event buffer [32];
  char *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  bool state;
  int in_stack_fffffffffffffca4;
  QEvdevKeyboardHandler *in_stack_fffffffffffffca8;
  int local_33c;
  int local_334;
  char local_328 [32];
  undefined1 local_308 [16];
  short asStack_2f8 [62];
  undefined1 in_stack_fffffffffffffd84;
  undefined1 in_stack_fffffffffffffd85;
  quint16 in_stack_fffffffffffffd86;
  QEvdevKeyboardHandler *in_stack_fffffffffffffd88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_308,0xaa,0x300);
  local_334 = 0;
  do {
    while( true ) {
      QFdContainer::get((QFdContainer *)&in_RDI[1].context.file);
      qVar5 = qt_safe_read((int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffca8,
                           CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      iVar4 = (int)qVar5;
      if (iVar4 == 0) {
        QMessageLogger::QMessageLogger
                  (in_RDI,(char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
                   in_stack_fffffffffffffc98);
        QMessageLogger::warning(local_328,"evdevkeyboard: Got EOF from the input device");
        goto LAB_00142850;
      }
      if (iVar4 < 0) break;
      local_334 = iVar4 + local_334;
      if ((ulong)(long)local_334 % 0x18 == 0) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (long)local_334;
        for (local_33c = 0; local_33c < SUB164(auVar3 / ZEXT816(0x18),0); local_33c = local_33c + 1)
        {
          if (asStack_2f8[(long)local_33c * 0xc] == 1) {
            led = processKeycode(in_stack_fffffffffffffd88,in_stack_fffffffffffffd86,
                                 (bool)in_stack_fffffffffffffd85,(bool)in_stack_fffffffffffffd84);
            state = SUB41((uint)in_stack_fffffffffffffca0 >> 0x18,0);
            if (led - CapsLockOff < 2) {
              switchLed(in_stack_fffffffffffffca8,led,state);
            }
            else if (led + 0xfe000000 < 2) {
              switchLed(in_stack_fffffffffffffca8,led,state);
            }
            else if (led + 0xfd000000 < 2) {
              switchLed(in_stack_fffffffffffffca8,led,state);
            }
          }
        }
LAB_00142850:
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return;
      }
    }
    piVar6 = __errno_location();
  } while ((*piVar6 == 4) || (piVar6 = __errno_location(), *piVar6 == 0xb));
  qErrnoWarning("evdevkeyboard: Could not read from input device");
  piVar6 = __errno_location();
  if (*piVar6 == 0x13) {
    plVar2 = (long *)in_RDI[1].context.function;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x20))();
    }
    in_RDI[1].context.function = (char *)0x0;
    QFdContainer::reset((QFdContainer *)
                        CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  }
  goto LAB_00142850;
}

Assistant:

void QEvdevKeyboardHandler::readKeycode()
{
    struct ::input_event buffer[32];
    int n = 0;

    forever {
        int result = qt_safe_read(m_fd.get(), reinterpret_cast<char *>(buffer) + n, sizeof(buffer) - n);

        if (result == 0) {
            qWarning("evdevkeyboard: Got EOF from the input device");
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning("evdevkeyboard: Could not read from input device");
                // If the device got disconnected, stop reading, otherwise we get flooded
                // by the above error over and over again.
                if (errno == ENODEV) {
                    delete m_notify;
                    m_notify = nullptr;
                    m_fd.reset();
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(buffer[0]) == 0)
                break;
        }
    }